

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int duckdb_fmt::v6::internal::parse_nonnegative_int<char,duckdb_fmt::v6::internal::error_handler&>
              (char **begin,char *end,error_handler *eh)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  allocator local_31;
  string local_30;
  
  cVar3 = **begin;
  pcVar2 = *begin + 1;
  if (cVar3 == '0') {
    *begin = pcVar2;
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      if (0xccccccc < uVar1) goto LAB_00348de0;
      uVar1 = (uVar1 * 10 + (int)cVar3) - 0x30;
      *begin = pcVar2;
      if (pcVar2 == end) break;
      cVar3 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while ((byte)(cVar3 - 0x30U) < 10);
    if ((int)uVar1 < 0) {
LAB_00348de0:
      std::__cxx11::string::string((string *)&local_30,"number is too big",&local_31);
      error_handler::on_error(eh,&local_30);
    }
  }
  return uVar1;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}